

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CppEmitter.cpp
# Opt level: O1

bool __thiscall
Hpipe::CppEmitter::bench
          (CppEmitter *this,
          vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *tds)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pTVar3;
  size_type sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TS *pTVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ostream *poVar12;
  StreamSep *pSVar13;
  undefined1 uVar14;
  pointer pcVar15;
  size_type sVar16;
  TrainingData *td;
  pointer pTVar17;
  string gpp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  StreamSepMaker ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  StreamSepMaker ss;
  ofstream fout;
  undefined1 local_1398 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1388 [3];
  string local_1350;
  string local_1330;
  string local_1310;
  undefined1 local_12f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12d8;
  _Alloc_hider local_12c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_12b8;
  _Alloc_hider local_12a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1298;
  _Alloc_hider local_1288;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1278;
  string local_1268;
  StreamSepMaker local_1248;
  vector<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_> *local_11c0;
  string local_11b8;
  string local_1198;
  string local_1178;
  string local_1158;
  string local_1138;
  StreamSep local_1118;
  StreamSep local_10d0;
  StreamSep local_1088;
  StreamSep local_1040;
  StreamSep local_ff8;
  StreamSep local_fb0;
  StreamSep local_f68;
  StreamSep local_f20;
  StreamSep local_ed8;
  StreamSep local_e90;
  StreamSep local_e48;
  StreamSep local_e00;
  StreamSep local_db8;
  StreamSep local_d70;
  StreamSep local_d28;
  StreamSep local_ce0;
  StreamSep local_c98;
  StreamSep local_c50;
  StreamSep local_c08;
  StreamSep local_bc0;
  StreamSep local_b78;
  StreamSep local_b30;
  StreamSep local_ae8;
  StreamSep local_aa0;
  StreamSep local_a58;
  StreamSep local_a10;
  StreamSep local_9c8;
  StreamSep local_980;
  StreamSep local_938;
  StreamSep local_8f0;
  StreamSep local_8a8;
  StreamSep local_860;
  StreamSep local_818;
  StreamSep local_7d0;
  StreamSep local_788;
  StreamSep local_740;
  StreamSep local_6f8;
  StreamSep local_6b0;
  StreamSep local_668;
  StreamSep local_620;
  StreamSep local_5d8;
  StreamSep local_590;
  StreamSep local_548;
  StreamSep local_500;
  StreamSep local_4b8;
  StreamSep local_470;
  StreamSep local_428;
  StreamSep local_3e0;
  StreamSep local_398;
  long local_350;
  filebuf local_348 [240];
  ios_base local_258 [264];
  StreamSep local_150;
  StreamSep local_108;
  StreamSep local_c0;
  StreamSep local_78;
  
  std::ofstream::ofstream(&local_350,"bench.cpp",_S_out);
  local_12f0._8_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0;
  local_12f0[0x10] = '\0';
  local_1398._0_8_ = local_1398 + 0x10;
  local_1398._8_8_ = (char *)0x0;
  local_1388[0]._M_local_buf[0] = '\0';
  paVar1 = &local_1350.field_2;
  local_1350._M_dataplus._M_p = (pointer)paVar1;
  local_12f0._0_8_ = local_12f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1350,"\n","");
  paVar2 = &local_1310.field_2;
  local_1310._M_string_length = 0;
  local_1310.field_2._M_local_buf[0] = '\0';
  local_1310._M_dataplus._M_p = (pointer)paVar2;
  StreamSepMaker::StreamSepMaker
            (&local_1248,(TS *)&local_350,(string *)local_12f0,(string *)local_1398,&local_1350,
             &local_1310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1310._M_dataplus._M_p != paVar2) {
    operator_delete(local_1310._M_dataplus._M_p,
                    CONCAT71(local_1310.field_2._M_allocated_capacity._1_7_,
                             local_1310.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1350._M_dataplus._M_p != paVar1) {
    operator_delete(local_1350._M_dataplus._M_p,
                    CONCAT71(local_1350.field_2._M_allocated_capacity._1_7_,
                             local_1350.field_2._M_local_buf[0]) + 1);
  }
  if ((undefined1 *)local_1398._0_8_ != local_1398 + 0x10) {
    operator_delete((void *)local_1398._0_8_,
                    CONCAT71(local_1388[0]._M_allocated_capacity._1_7_,local_1388[0]._M_local_buf[0]
                            ) + 1);
  }
  if ((undefined1 *)local_12f0._0_8_ != local_12f0 + 0x10) {
    operator_delete((void *)local_12f0._0_8_,CONCAT71(local_12f0._17_7_,local_12f0[0x10]) + 1);
  }
  local_1398._0_8_ = local_1398 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1398,"    ","");
  local_1350._M_string_length = 0;
  local_1350.field_2._M_local_buf[0] = '\0';
  local_1350._M_dataplus._M_p = (pointer)paVar1;
  local_1310._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1310,"\n","");
  local_1138._M_string_length = 0;
  local_1138.field_2._M_local_buf[0] = '\0';
  local_1138._M_dataplus._M_p = (pointer)&local_1138.field_2;
  StreamSepMaker::StreamSepMaker
            ((StreamSepMaker *)local_12f0,(TS *)&local_350,(string *)local_1398,&local_1350,
             &local_1310,&local_1138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1138._M_dataplus._M_p != &local_1138.field_2) {
    operator_delete(local_1138._M_dataplus._M_p,
                    CONCAT71(local_1138.field_2._M_allocated_capacity._1_7_,
                             local_1138.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1310._M_dataplus._M_p != paVar2) {
    operator_delete(local_1310._M_dataplus._M_p,
                    CONCAT71(local_1310.field_2._M_allocated_capacity._1_7_,
                             local_1310.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1350._M_dataplus._M_p != paVar1) {
    operator_delete(local_1350._M_dataplus._M_p,
                    CONCAT71(local_1350.field_2._M_allocated_capacity._1_7_,
                             local_1350.field_2._M_local_buf[0]) + 1);
  }
  if ((ostream *)local_1398._0_8_ != (ostream *)(local_1398 + 0x10)) {
    operator_delete((void *)local_1398._0_8_,
                    CONCAT71(local_1388[0]._M_allocated_capacity._1_7_,local_1388[0]._M_local_buf[0]
                            ) + 1);
  }
  StreamSepMaker::operator<<(&local_398,&local_1248,(char (*) [31])"#include <Hpipe/CbStringPtr.h>")
  ;
  StreamSep::~StreamSep(&local_398);
  StreamSepMaker::operator<<(&local_3e0,&local_1248,(char (*) [25])"#include <Hpipe/Print.h>");
  StreamSep::~StreamSep(&local_3e0);
  StreamSepMaker::operator<<(&local_428,&local_1248,(char (*) [20])"#include <iostream>");
  StreamSep::~StreamSep(&local_428);
  StreamSepMaker::operator<<(&local_470,&local_1248,(char (*) [19])"#include <sstream>");
  StreamSep::~StreamSep(&local_470);
  StreamSepMaker::operator<<(&local_4b8,&local_1248,(char (*) [17])"#include <ctime>");
  StreamSep::~StreamSep(&local_4b8);
  StreamSepMaker::operator<<(&local_500,&local_1248,(char (*) [1])0x17c0d4);
  StreamSep::~StreamSep(&local_500);
  StreamSepMaker::operator<<
            (&local_548,&local_1248,(char (*) [40])"#define HPIPE_DEFINITION_PREFIX Bench::");
  StreamSep::~StreamSep(&local_548);
  StreamSepMaker::operator<<(&local_590,&local_1248,(char (*) [1])0x17c0d4);
  StreamSep::~StreamSep(&local_590);
  write_preliminaries(this,&local_1248);
  StreamSepMaker::operator<<(&local_5d8,&local_1248,(char (*) [1])0x17c0d4);
  StreamSep::~StreamSep(&local_5d8);
  StreamSepMaker::operator<<(&local_620,&local_1248,(char (*) [15])"struct Bench {");
  StreamSep::~StreamSep(&local_620);
  StreamSepMaker::operator<<
            (&local_668,&local_1248,
             (char (*) [107])
             "    void exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display );"
            );
  StreamSep::~StreamSep(&local_668);
  write_declarations(this,(StreamSepMaker *)local_12f0);
  StreamSepMaker::operator<<(&local_6b0,&local_1248,(char (*) [27])"    std::ostringstream os;");
  StreamSep::~StreamSep(&local_6b0);
  StreamSepMaker::operator<<(&local_6f8,&local_1248,(char (*) [26])"    HpipeData hpipe_data;");
  StreamSep::~StreamSep(&local_6f8);
  StreamSepMaker::operator<<(&local_740,&local_1248,(char (*) [22])"    unsigned cpt = 0;");
  StreamSep::~StreamSep(&local_740);
  StreamSepMaker::operator<<(&local_788,&local_1248,(char (*) [3])"};");
  StreamSep::~StreamSep(&local_788);
  StreamSepMaker::operator<<
            (&local_7d0,&local_1248,
             (char (*) [111])
             "void Bench::exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display ) {"
            );
  StreamSep::~StreamSep(&local_7d0);
  switch(this->buffer_type) {
  case 0:
    StreamSepMaker::operator<<
              (&local_818,(StreamSepMaker *)local_12f0,
               (char (*) [49])"Hpipe::Buffer *buf = Hpipe::Buffer::New( size );");
    StreamSep::~StreamSep(&local_818);
    StreamSepMaker::operator<<
              (&local_860,(StreamSepMaker *)local_12f0,
               (char (*) [33])"memcpy( buf->data, data, size );");
    StreamSep::~StreamSep(&local_860);
    StreamSepMaker::operator<<
              (&local_8a8,(StreamSepMaker *)local_12f0,(char (*) [18])"buf->used = size;");
    StreamSep::~StreamSep(&local_8a8);
    StreamSepMaker::operator<<
              (&local_8f0,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_8f0);
    StreamSepMaker::operator<<
              (&local_938,(StreamSepMaker *)local_12f0,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_938);
    StreamSepMaker::operator<<
              (&local_980,(StreamSepMaker *)local_12f0,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_980);
    StreamSepMaker::operator<<
              (&local_9c8,(StreamSepMaker *)local_12f0,(char (*) [27])"    parse( buf, 0, size );");
    StreamSep::~StreamSep(&local_9c8);
    StreamSepMaker::operator<<(&local_a10,(StreamSepMaker *)local_12f0,(char (*) [2])0x17e0da);
    StreamSep::~StreamSep(&local_a10);
    StreamSepMaker::operator<<
              (&local_a58,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_a58);
    pSVar13 = &local_78;
    StreamSepMaker::operator<<(pSVar13,(StreamSepMaker *)local_12f0,(char (*) [30])0x17d316);
    break;
  case 1:
    StreamSepMaker::operator<<
              (&local_aa0,(StreamSepMaker *)local_12f0,
               (char (*) [49])"Hpipe::Buffer *buf = Hpipe::Buffer::New( size );");
    StreamSep::~StreamSep(&local_aa0);
    StreamSepMaker::operator<<
              (&local_ae8,(StreamSepMaker *)local_12f0,
               (char (*) [33])"memcpy( buf->data, data, size );");
    StreamSep::~StreamSep(&local_ae8);
    StreamSepMaker::operator<<
              (&local_b30,(StreamSepMaker *)local_12f0,(char (*) [18])"buf->used = size;");
    StreamSep::~StreamSep(&local_b30);
    StreamSepMaker::operator<<
              (&local_b78,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_b78);
    StreamSepMaker::operator<<
              (&local_bc0,(StreamSepMaker *)local_12f0,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_bc0);
    StreamSepMaker::operator<<
              (&local_c08,(StreamSepMaker *)local_12f0,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_c08);
    StreamSepMaker::operator<<
              (&local_c50,(StreamSepMaker *)local_12f0,(char (*) [24])"    parse( buf, true );");
    StreamSep::~StreamSep(&local_c50);
    StreamSepMaker::operator<<(&local_c98,(StreamSepMaker *)local_12f0,(char (*) [2])0x17e0da);
    StreamSep::~StreamSep(&local_c98);
    StreamSepMaker::operator<<
              (&local_ce0,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t1 = std::clock();");
    StreamSep::~StreamSep(&local_ce0);
    pSVar13 = &local_c0;
    StreamSepMaker::operator<<(pSVar13,(StreamSepMaker *)local_12f0,(char (*) [30])0x17d316);
    break;
  case 2:
    StreamSepMaker::operator<<
              (&local_d28,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_d28);
    StreamSepMaker::operator<<
              (&local_d70,(StreamSepMaker *)local_12f0,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_d70);
    StreamSepMaker::operator<<
              (&local_db8,(StreamSepMaker *)local_12f0,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_db8);
    StreamSepMaker::operator<<
              (&local_e00,(StreamSepMaker *)local_12f0,
               (char (*) [36])"    parse( data, data - 1 + size );");
    StreamSep::~StreamSep(&local_e00);
    StreamSepMaker::operator<<(&local_e48,(StreamSepMaker *)local_12f0,(char (*) [2])0x17e0da);
    StreamSep::~StreamSep(&local_e48);
    pSVar13 = &local_108;
    StreamSepMaker::operator<<
              (pSVar13,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t1 = std::clock();");
    break;
  case 3:
    StreamSepMaker::operator<<
              (&local_e90,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t0 = std::clock();");
    StreamSep::~StreamSep(&local_e90);
    StreamSepMaker::operator<<
              (&local_ed8,(StreamSepMaker *)local_12f0,
               (char (*) [48])"for( unsigned var = 0; var < 1000000; ++var ) {");
    StreamSep::~StreamSep(&local_ed8);
    StreamSepMaker::operator<<
              (&local_f20,(StreamSepMaker *)local_12f0,
               (char (*) [48])"    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );");
    StreamSep::~StreamSep(&local_f20);
    StreamSepMaker::operator<<
              (&local_f68,(StreamSepMaker *)local_12f0,(char (*) [19])"    parse( data );");
    StreamSep::~StreamSep(&local_f68);
    StreamSepMaker::operator<<(&local_fb0,(StreamSepMaker *)local_12f0,(char (*) [2])0x17e0da);
    StreamSep::~StreamSep(&local_fb0);
    pSVar13 = &local_150;
    StreamSepMaker::operator<<
              (pSVar13,(StreamSepMaker *)local_12f0,(char (*) [24])"auto t1 = std::clock();");
    break;
  default:
    goto switchD_0014c15d_default;
  }
  StreamSep::~StreamSep(pSVar13);
switchD_0014c15d_default:
  StreamSepMaker::operator<<(&local_ff8,&local_1248,(char (*) [19])"    if ( display )");
  StreamSep::~StreamSep(&local_ff8);
  StreamSepMaker::operator<<
            (&local_1040,&local_1248,
             (char (*) [107])
             "        std::cout << name << \", \" << display << \" -> \" << double( t1 - t0 ) / CLOCKS_PER_SEC << std::endl;"
            );
  StreamSep::~StreamSep(&local_1040);
  StreamSepMaker::operator<<(&local_1088,&local_1248,(char (*) [2])0x17e0da);
  StreamSep::~StreamSep(&local_1088);
  write_definitions(this,&local_1248);
  StreamSepMaker::operator<<
            (&local_10d0,&local_1248,(char (*) [36])"int main( int argc, char **argv ) {");
  StreamSep::~StreamSep(&local_10d0);
  pTVar3 = (tds->
           super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_11c0 = tds;
  poVar12 = local_1248.stream;
  for (pTVar17 = (tds->
                 super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                 )._M_impl.super__Vector_impl_data._M_start; pTVar17 != pTVar3;
      pTVar17 = pTVar17 + 1) {
    local_1248.stream = poVar12;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,"    static unsigned char name_",0x1e);
    poVar12 = std::ostream::_M_insert<void_const*>(poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[] = { ",7);
    sVar4 = (pTVar17->name)._M_string_length;
    if (sVar4 != 0) {
      pcVar15 = (pTVar17->name)._M_dataplus._M_p;
      sVar16 = 0;
      do {
        poVar12 = (ostream *)
                  std::ostream::operator<<((ostream *)local_1248.stream,(int)pcVar15[sVar16]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
        sVar16 = sVar16 + 1;
      } while (sVar4 != sVar16);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1248.stream," 0 };\n",6);
    pTVar8 = local_1248.stream;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1248.stream,"    static unsigned char inp_",0x1d);
    poVar12 = std::ostream::_M_insert<void_const*>(pTVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,"[] = { ",7);
    sVar4 = (pTVar17->inp)._M_string_length;
    if (sVar4 != 0) {
      pcVar15 = (pTVar17->inp)._M_dataplus._M_p;
      sVar16 = 0;
      do {
        poVar12 = (ostream *)
                  std::ostream::operator<<((ostream *)local_1248.stream,(int)pcVar15[sVar16]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,",",1);
        sVar16 = sVar16 + 1;
      } while (sVar4 != sVar16);
    }
    std::__ostream_insert<char,std::char_traits<char>>(local_1248.stream," 0 };\n",6);
    pTVar8 = local_1248.stream;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1248.stream,"    static double freq_",0x17);
    poVar12 = std::ostream::_M_insert<void_const*>(pTVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12," = ",3);
    poVar12 = std::ostream::_M_insert<double>(pTVar17->freq);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,";\n",2);
    poVar12 = local_1248.stream;
  }
  pTVar3 = (local_11c0->
           super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar17 = (local_11c0->
                 super__Vector_base<Hpipe::Lexer::TrainingData,_std::allocator<Hpipe::Lexer::TrainingData>_>
                 )._M_impl.super__Vector_impl_data._M_start; pTVar17 != pTVar3;
      pTVar17 = pTVar17 + 1) {
    StreamSepMaker::operator<<
              ((StreamSep *)local_1398,&local_1248,(char (*) [24])"    Bench().exec( name_");
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_1398._0_8_,(char *)local_1398._8_8_,
                         CONCAT71(local_1388[0]._M_allocated_capacity._1_7_,
                                  local_1388[0]._M_local_buf[0]));
    std::ostream::_M_insert<void_const*>(poVar12);
    pSVar13 = StreamSep::operator<<((StreamSep *)local_1398,(char (*) [7])", inp_");
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar13->stream,(pSVar13->sep)._M_dataplus._M_p,
                         (pSVar13->sep)._M_string_length);
    std::ostream::_M_insert<void_const*>(poVar12);
    pSVar13 = StreamSep::operator<<(pSVar13,(char (*) [3])0x17f63d);
    poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar13->stream,(pSVar13->sep)._M_dataplus._M_p,
                         (pSVar13->sep)._M_string_length);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    StreamSep::operator<<(pSVar13,(char (*) [30])", argc > 1 ? argv[ 1 ] : 0 );");
    StreamSep::~StreamSep((StreamSep *)local_1398);
  }
  StreamSepMaker::operator<<(&local_1118,&local_1248,(char (*) [2])0x17e0da);
  StreamSep::~StreamSep(&local_1118);
  std::ofstream::close();
  local_1398._0_8_ = local_1398 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1398,"g++ -O6 -g3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp",
             "");
  pcVar15 = (pointer)local_1398._0_8_;
  local_1158._M_dataplus._M_p = (pointer)&local_1158.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1158,local_1398._0_8_,(char *)(local_1398._8_8_ + local_1398._0_8_));
  bVar9 = anon_unknown_12::_exec(&local_1158,SUB81(pcVar15,0));
  if (bVar9) {
    local_1178._M_dataplus._M_p = (pointer)&local_1178.field_2;
    uVar14 = 0x5b;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_1178,"./bench \'without profile\'","");
    bVar10 = anon_unknown_12::_exec(&local_1178,(bool)uVar14);
    if (!bVar10) goto LAB_0014cb7b;
    local_1268._M_dataplus._M_p = (pointer)&local_1268.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1268,local_1398._0_8_,(char *)(local_1398._8_8_ + local_1398._0_8_))
    ;
    uVar14 = 0xcb;
    std::__cxx11::string::append((char *)&local_1268);
    bVar10 = anon_unknown_12::_exec(&local_1268,(bool)uVar14);
    if (!bVar10) {
      bVar10 = true;
      goto LAB_0014cb7e;
    }
    local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
    uVar14 = 0xdf;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1198,"./bench","");
    bVar10 = anon_unknown_12::_exec(&local_1198,(bool)uVar14);
    if (!bVar10) {
      bVar10 = true;
      bVar7 = true;
      goto LAB_0014cb84;
    }
    local_1330._M_dataplus._M_p = (pointer)&local_1330.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1330,local_1398._0_8_,(char *)(local_1398._8_8_ + local_1398._0_8_))
    ;
    uVar14 = 0xe7;
    std::__cxx11::string::append((char *)&local_1330);
    bVar10 = anon_unknown_12::_exec(&local_1330,(bool)uVar14);
    if (bVar10) {
      local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
      uVar14 = 0x75;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_11b8,"./bench \'with profile\'","");
      bVar11 = anon_unknown_12::_exec(&local_11b8,(bool)uVar14);
      bVar10 = true;
      bVar7 = true;
      bVar6 = true;
      bVar5 = true;
      goto LAB_0014cb88;
    }
    bVar10 = true;
    bVar7 = true;
    bVar6 = true;
  }
  else {
LAB_0014cb7b:
    bVar10 = false;
LAB_0014cb7e:
    bVar7 = false;
LAB_0014cb84:
    bVar6 = false;
  }
  bVar5 = false;
  bVar11 = false;
LAB_0014cb88:
  if ((bVar5) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_11b8._M_dataplus._M_p != &local_11b8.field_2)) {
    operator_delete(local_11b8._M_dataplus._M_p,local_11b8.field_2._M_allocated_capacity + 1);
  }
  if ((bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1330._M_dataplus._M_p != &local_1330.field_2)) {
    operator_delete(local_1330._M_dataplus._M_p,local_1330.field_2._M_allocated_capacity + 1);
  }
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1198._M_dataplus._M_p != &local_1198.field_2)) {
    operator_delete(local_1198._M_dataplus._M_p,local_1198.field_2._M_allocated_capacity + 1);
  }
  if ((bVar10) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1268._M_dataplus._M_p != &local_1268.field_2)) {
    operator_delete(local_1268._M_dataplus._M_p,local_1268.field_2._M_allocated_capacity + 1);
  }
  if ((bVar9) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1178._M_dataplus._M_p != &local_1178.field_2)) {
    operator_delete(local_1178._M_dataplus._M_p,local_1178.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1158._M_dataplus._M_p != &local_1158.field_2) {
    operator_delete(local_1158._M_dataplus._M_p,local_1158.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_1398._0_8_ != local_1398 + 0x10) {
    operator_delete((void *)local_1398._0_8_,
                    CONCAT71(local_1388[0]._M_allocated_capacity._1_7_,local_1388[0]._M_local_buf[0]
                            ) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1288._M_p != &local_1278) {
    operator_delete(local_1288._M_p,local_1278._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12a8._M_p != &local_1298) {
    operator_delete(local_12a8._M_p,local_1298._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12c8._M_p != &local_12b8) {
    operator_delete(local_12c8._M_p,local_12b8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_12f0._8_8_ != &local_12d8) {
    operator_delete((void *)local_12f0._8_8_,local_12d8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248.end._M_dataplus._M_p != &local_1248.end.field_2) {
    operator_delete(local_1248.end._M_dataplus._M_p,local_1248.end.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248.sep._M_dataplus._M_p != &local_1248.sep.field_2) {
    operator_delete(local_1248.sep._M_dataplus._M_p,local_1248.sep.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248.beg._M_dataplus._M_p != &local_1248.beg.field_2) {
    operator_delete(local_1248.beg._M_dataplus._M_p,local_1248.beg.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1248.first_beg._M_dataplus._M_p != &local_1248.first_beg.field_2) {
    operator_delete(local_1248.first_beg._M_dataplus._M_p,
                    local_1248.first_beg.field_2._M_allocated_capacity + 1);
  }
  local_350 = _VTT;
  *(undefined8 *)(local_348 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_348);
  std::ios_base::~ios_base(local_258);
  return bVar11;
}

Assistant:

bool CppEmitter::bench(const std::vector<Lexer::TrainingData> &tds) {
    std::ofstream fout( "bench.cpp" );
    StreamSepMaker ss( fout );
    StreamSepMaker ns( fout, "    " );
    ss << "#include <Hpipe/CbStringPtr.h>";
    ss << "#include <Hpipe/Print.h>";
    ss << "#include <iostream>";
    ss << "#include <sstream>";
    ss << "#include <ctime>";    
    ss << "";
    ss << "#define HPIPE_DEFINITION_PREFIX Bench::";
    ss << "";
    write_preliminaries( ss );
    ss << "";
    ss << "struct Bench {";
    ss << "    void exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display );";
    write_declarations( ns );
    ss << "    std::ostringstream os;";
    ss << "    HpipeData hpipe_data;";
    ss << "    unsigned cpt = 0;";
    ss << "};";

    ss << "void Bench::exec( const unsigned char *name, const unsigned char *data, unsigned size, const char *display ) {";
    switch ( buffer_type ) {
    case BT_HPIPE_CB_STRING_PTR:
        ns << "Hpipe::Buffer *buf = Hpipe::Buffer::New( size );";
        ns << "memcpy( buf->data, data, size );";
        ns << "buf->used = size;";
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( buf, 0, size );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        ns << "HPIPE_BUFF_T::dec_ref( buf );";
        break;
    case BT_HPIPE_BUFFER:
        ns << "Hpipe::Buffer *buf = Hpipe::Buffer::New( size );";
        ns << "memcpy( buf->data, data, size );";
        ns << "buf->used = size;";
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( buf, true );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        ns << "HPIPE_BUFF_T::dec_ref( buf );";
        break;
    case BT_BEG_END:
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( data, data - 1 + size );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        break;
    case BT_C_STR:
        ns << "auto t0 = std::clock();";
        ns << "for( unsigned var = 0; var < 1000000; ++var ) {";
        ns << "    Bench::HPIPE_DATA_CTOR_NAME( &hpipe_data );";
        ns << "    parse( data );";
        ns << "}";
        ns << "auto t1 = std::clock();";
        break;
    }
    ss << "    if ( display )";
    ss << "        std::cout << name << \", \" << display << \" -> \" << double( t1 - t0 ) / CLOCKS_PER_SEC << std::endl;";
    ss << "}";

    write_definitions( ss );

    ss << "int main( int argc, char **argv ) {";
    for( const Lexer::TrainingData &td : tds ) {
        *ss.stream << "    static unsigned char name_" << &td << "[] = { "; for( char c : td.name ) *ss.stream << (int)c << ","; *ss.stream << " 0 };\n";
        *ss.stream << "    static unsigned char inp_"  << &td << "[] = { "; for( char c : td.inp  ) *ss.stream << (int)c << ","; *ss.stream << " 0 };\n";
        *ss.stream << "    static double freq_"        << &td << " = " << td.freq << ";\n";
    }
    for( const Lexer::TrainingData &td : tds )
        ss << "    Bench().exec( name_" << &td << ", inp_" << &td << ", " << td.inp.size() << ", argc > 1 ? argv[ 1 ] : 0 );";
    ss << "}";
    fout.close();

    bool clang = false;
    if ( clang ) {
        std::string gpp = "clang++ -O3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
        return _exec( gpp ) && _exec( "echo without profile", false ) && _exec( "./bench 'without profile'" ) &&
               _exec( gpp + " -fprofile-instr-generate" ) && _exec( "./bench -nodisp" ) &&
               _exec( "llvm-profdata-3.8 merge -output=default.profdata default.profraw" ) &&
               _exec( gpp + " -fprofile-instr-use"      ) && _exec( "./bench 'with profile'" );
    }

    //std::string gpp = "g++ -O6 -g3 -fno-reorder-blocks -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
    std::string gpp = "g++ -O6 -g3 -march=native -std=c++14 -Isrc/ -o bench bench.cpp";
    return _exec( gpp ) && _exec( "./bench 'without profile'" )
        && _exec( gpp + " -fprofile-generate" ) && _exec( "./bench" )
        && _exec( gpp + " -fprofile-use"      ) && _exec( "./bench 'with profile'" )
            ; // -fno-reorder-blocks-and-partition
}